

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_algorithms.h
# Opt level: O1

void __thiscall
Labeling2D<(Connectivity2D)4,_false>::Labeling2D(Labeling2D<(Connectivity2D)4,_false> *this)

{
  tuple<YacclabTensorOutput2D_*,_std::default_delete<YacclabTensorOutput2D>_> tVar1;
  _Head_base<0UL,_YacclabTensorInput2D_*,_false> local_20;
  __uniq_ptr_impl<YacclabTensorOutput2D,_std::default_delete<YacclabTensorOutput2D>_> local_18;
  
  local_20._M_head_impl = (YacclabTensorInput2D *)operator_new(8);
  ((local_20._M_head_impl)->super_YacclabTensorInput).super_YacclabTensor._vptr_YacclabTensor =
       (_func_int **)&PTR_Release_00331a60;
  tVar1.super__Tuple_impl<0UL,_YacclabTensorOutput2D_*,_std::default_delete<YacclabTensorOutput2D>_>
  .super__Head_base<0UL,_YacclabTensorOutput2D_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_YacclabTensorOutput2D_*,_std::default_delete<YacclabTensorOutput2D>_>)
       operator_new(0x68);
  *(undefined ***)
   tVar1.
   super__Tuple_impl<0UL,_YacclabTensorOutput2D_*,_std::default_delete<YacclabTensorOutput2D>_>.
   super__Head_base<0UL,_YacclabTensorOutput2D_*,_false>._M_head_impl = &PTR_Release_00331970;
  cv::Mat::Mat((Mat *)((long)tVar1.
                             super__Tuple_impl<0UL,_YacclabTensorOutput2D_*,_std::default_delete<YacclabTensorOutput2D>_>
                             .super__Head_base<0UL,_YacclabTensorOutput2D_*,_false>._M_head_impl + 8
                      ));
  *(uint *)((long)tVar1.
                  super__Tuple_impl<0UL,_YacclabTensorOutput2D_*,_std::default_delete<YacclabTensorOutput2D>_>
                  .super__Head_base<0UL,_YacclabTensorOutput2D_*,_false>._M_head_impl + 8) =
       *(uint *)((long)tVar1.
                       super__Tuple_impl<0UL,_YacclabTensorOutput2D_*,_std::default_delete<YacclabTensorOutput2D>_>
                       .super__Head_base<0UL,_YacclabTensorOutput2D_*,_false>._M_head_impl + 8) &
       0xfffff000 | 4;
  local_18._M_t.
  super__Tuple_impl<0UL,_YacclabTensorOutput2D_*,_std::default_delete<YacclabTensorOutput2D>_>.
  super__Head_base<0UL,_YacclabTensorOutput2D_*,_false>._M_head_impl =
       (tuple<YacclabTensorOutput2D_*,_std::default_delete<YacclabTensorOutput2D>_>)
       (tuple<YacclabTensorOutput2D_*,_std::default_delete<YacclabTensorOutput2D>_>)
       tVar1.
       super__Tuple_impl<0UL,_YacclabTensorOutput2D_*,_std::default_delete<YacclabTensorOutput2D>_>.
       super__Head_base<0UL,_YacclabTensorOutput2D_*,_false>._M_head_impl;
  Labeling2D(this,(unique_ptr<YacclabTensorInput2D,_std::default_delete<YacclabTensorInput2D>_> *)
                  &local_20,
             (unique_ptr<YacclabTensorOutput2D,_std::default_delete<YacclabTensorOutput2D>_> *)
             &local_18);
  if ((_Tuple_impl<0UL,_YacclabTensorOutput2D_*,_std::default_delete<YacclabTensorOutput2D>_>)
      local_18._M_t.
      super__Tuple_impl<0UL,_YacclabTensorOutput2D_*,_std::default_delete<YacclabTensorOutput2D>_>.
      super__Head_base<0UL,_YacclabTensorOutput2D_*,_false>._M_head_impl !=
      (YacclabTensorOutput2D *)0x0) {
    (**(code **)(*(long *)local_18._M_t.
                          super__Tuple_impl<0UL,_YacclabTensorOutput2D_*,_std::default_delete<YacclabTensorOutput2D>_>
                          .super__Head_base<0UL,_YacclabTensorOutput2D_*,_false>._M_head_impl + 0x10
                ))();
  }
  local_18._M_t.
  super__Tuple_impl<0UL,_YacclabTensorOutput2D_*,_std::default_delete<YacclabTensorOutput2D>_>.
  super__Head_base<0UL,_YacclabTensorOutput2D_*,_false>._M_head_impl =
       (tuple<YacclabTensorOutput2D_*,_std::default_delete<YacclabTensorOutput2D>_>)
       (_Tuple_impl<0UL,_YacclabTensorOutput2D_*,_std::default_delete<YacclabTensorOutput2D>_>)0x0;
  if (local_20._M_head_impl != (YacclabTensorInput2D *)0x0) {
    (*((local_20._M_head_impl)->super_YacclabTensorInput).super_YacclabTensor._vptr_YacclabTensor[2]
    )();
  }
  return;
}

Assistant:

Labeling2D() : Labeling2D(std::make_unique<YacclabTensorInput2D>(), std::make_unique<YacclabTensorOutput2D>()) {}